

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_ExrMetadata_Test::TestBody(Image_ExrMetadata_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  expected;
  bool bVar2;
  int iVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar4;
  Allocator alloc;
  RGBColorSpace *actual;
  iterator iVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  char *pcVar8;
  char *in_R9;
  long lVar9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Point2i fullRes;
  string filename;
  Bounds2i pb;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  stringVectors;
  ImageMetadata outMetadata;
  ImageAndMetadata read;
  Image image;
  AssertHelper local_5d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  key_type local_5b8;
  AssertHelper local_598;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_590;
  string local_588;
  Bounds2<int> local_568;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_558;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_538;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_518;
  ImageMetadata local_4e8;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  long local_3a8 [2];
  long local_398 [13];
  polymorphic_allocator<unsigned_char> local_330;
  uchar *local_328;
  size_t local_320;
  size_t local_318;
  polymorphic_allocator<pbrt::Half> local_310;
  Half *local_308;
  size_t local_300;
  size_t local_2f8;
  polymorphic_allocator<float> local_2f0;
  float *local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  ImageMetadata local_2d0;
  ColorEncodingHandle local_1d0;
  Image local_1c8;
  SquareMatrix<4> local_b0;
  SquareMatrix<4> local_70;
  
  GetFloatPixels(&local_538,(Point2i)0x2000000010,3);
  local_4e8.renderTimeSeconds = (optional<float>)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_558,&local_538,(polymorphic_allocator<float> *)&local_4e8);
  local_3e8._0_8_ = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"R","");
  _Var7._M_p = local_3c8 + 0x10;
  local_3c8._0_8_ = _Var7._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"G","");
  _Var6._M_p = (pointer)local_398;
  local_3a8[0] = (long)_Var6._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"B","");
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
  pbrt::Image::Image(&local_1c8,&local_558,(Point2i)0x2000000010,channels);
  lVar9 = -0x60;
  do {
    if ((long *)_Var6._M_p != *(long **)((long)_Var6._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_p + -0x10),*(long *)_Var6._M_p + 1);
    }
    _Var6._M_p = _Var6._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_558.nStored = 0;
  (*(local_558.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_558.alloc.memoryResource,local_558.ptr,local_558.nAlloc << 2,4);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"metadata.exr","");
  local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4e8.cameraFromWorld.set = false;
  local_4e8.NDCFromWorld.set = false;
  local_4e8.pixelBounds.set = false;
  local_4e8.fullResolution.set = false;
  local_4e8.samplesPerPixel.set = false;
  local_4e8.MSE.set = false;
  local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4e8.colorSpace.optionalValue = pbrt::RGBColorSpace::Rec2020;
  local_4e8.colorSpace.set = true;
  local_4e8.renderTimeSeconds.optionalValue =
       (aligned_storage_t<sizeof(float),_alignof(float)>)0x449a4000;
  local_4e8.renderTimeSeconds.set = true;
  local_70.m[0][0] = 3.0;
  local_70.m[0][1] = 1.0;
  local_70.m[0][2] = 4.0;
  local_70.m[0][3] = 1.0;
  local_70.m[1][0] = 5.0;
  local_70.m[1][1] = 9.0;
  local_70.m[1][2] = 2.0;
  local_70.m[1][3] = 3.1415927;
  local_70.m[2][0] = 2.0;
  local_70.m[2][1] = 7.0;
  local_70.m[2][2] = 1.0;
  local_70.m[2][3] = 8.0;
  local_70.m[3][0] = 2.0;
  local_70.m[3][1] = 8.0;
  local_70.m[3][2] = 1.0;
  local_70.m[3][3] = 2.7182817;
  local_b0.m[0][0] = 1.5;
  local_b0.m[0][1] = 2.5;
  local_b0.m[0][2] = 3.5;
  local_b0.m[0][3] = 4.75;
  local_b0.m[1][0] = 5.333;
  local_b0.m[1][1] = 6.2135;
  local_b0.m[1][2] = -351.2;
  local_b0.m[1][3] = -552.0;
  local_b0.m[2][0] = 63.2;
  local_b0.m[2][1] = 47.2;
  local_b0.m[2][2] = 3.1415927;
  local_b0.m[2][3] = 0.5403023;
  local_b0.m[3][0] = 0.0;
  local_b0.m[3][1] = -14.0;
  local_b0.m[3][2] = 6.0;
  local_b0.m[3][3] = 1e-10;
  local_568.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
  local_568.pMin.super_Tuple2<pbrt::Point2,_int>.y = 10;
  local_568.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x12;
  local_568.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x2a;
  local_590 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0xc8000003e8
  ;
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4e8.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3e8._0_8_ = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"foo","");
  local_3c8._0_8_ = _Var7._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"bar","");
  paVar1 = &local_5b8.field_2;
  local_5b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"yolo","");
  pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&local_518,&local_5b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>(pvVar4,local_3e8,local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  lVar9 = -0x40;
  do {
    if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
    }
    _Var7._M_p = _Var7._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_4e8.cameraFromWorld.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_70.m[0][0];
  local_4e8.cameraFromWorld.optionalValue._4_4_ = local_70.m[0][1];
  local_4e8.cameraFromWorld.optionalValue._8_4_ = local_70.m[0][2];
  local_4e8.cameraFromWorld.optionalValue._12_4_ = local_70.m[0][3];
  local_4e8.cameraFromWorld.optionalValue._16_4_ = local_70.m[1][0];
  local_4e8.cameraFromWorld.optionalValue._20_4_ = local_70.m[1][1];
  local_4e8.cameraFromWorld.optionalValue._24_4_ = local_70.m[1][2];
  local_4e8.cameraFromWorld.optionalValue._28_4_ = local_70.m[1][3];
  local_4e8.cameraFromWorld.optionalValue._32_4_ = local_70.m[2][0];
  local_4e8.cameraFromWorld.optionalValue._36_4_ = local_70.m[2][1];
  local_4e8.cameraFromWorld.optionalValue._40_4_ = local_70.m[2][2];
  local_4e8.cameraFromWorld.optionalValue._44_4_ = local_70.m[2][3];
  local_4e8.cameraFromWorld.optionalValue._48_4_ = local_70.m[3][0];
  local_4e8.cameraFromWorld.optionalValue._52_4_ = local_70.m[3][1];
  local_4e8.cameraFromWorld.optionalValue._56_4_ = local_70.m[3][2];
  local_4e8.cameraFromWorld.optionalValue._60_4_ = local_70.m[3][3];
  local_4e8.cameraFromWorld.set = true;
  local_4e8.NDCFromWorld.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_b0.m[0][0];
  local_4e8.NDCFromWorld.optionalValue._4_4_ = local_b0.m[0][1];
  local_4e8.NDCFromWorld.optionalValue._8_4_ = local_b0.m[0][2];
  local_4e8.NDCFromWorld.optionalValue._12_4_ = local_b0.m[0][3];
  local_4e8.NDCFromWorld.optionalValue._16_4_ = local_b0.m[1][0];
  local_4e8.NDCFromWorld.optionalValue._20_4_ = local_b0.m[1][1];
  local_4e8.NDCFromWorld.optionalValue._24_4_ = local_b0.m[1][2];
  local_4e8.NDCFromWorld.optionalValue._28_4_ = local_b0.m[1][3];
  local_4e8.NDCFromWorld.optionalValue._32_4_ = local_b0.m[2][0];
  local_4e8.NDCFromWorld.optionalValue._36_4_ = local_b0.m[2][1];
  local_4e8.NDCFromWorld.optionalValue._40_4_ = local_b0.m[2][2];
  local_4e8.NDCFromWorld.optionalValue._44_4_ = local_b0.m[2][3];
  local_4e8.NDCFromWorld.optionalValue._48_4_ = local_b0.m[3][0];
  local_4e8.NDCFromWorld.optionalValue._52_4_ = local_b0.m[3][1];
  local_4e8.NDCFromWorld.optionalValue._56_4_ = local_b0.m[3][2];
  local_4e8.NDCFromWorld.optionalValue._60_4_ = local_b0.m[3][3];
  local_4e8.NDCFromWorld.set = true;
  local_4e8.pixelBounds.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_568.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  local_4e8.pixelBounds.optionalValue._4_4_ = local_568.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  local_4e8.pixelBounds.optionalValue._8_4_ = local_568.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  local_4e8.pixelBounds.optionalValue._12_4_ = local_568.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  local_4e8.pixelBounds.set = true;
  local_4e8.fullResolution.optionalValue = local_590;
  local_4e8.fullResolution.set = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator=(&local_4e8.stringVectors._M_t,&local_518);
  bVar2 = pbrt::Image::Write(&local_1c8,&local_588,&local_4e8);
  local_5b8._M_dataplus._M_p._0_1_ = bVar2;
  local_5b8._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3e8,(internal *)&local_5b8,
               (AssertionResult *)"image.Write(filename, outMetadata)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1ad,(char *)local_3e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if ((undefined1 *)local_3e8._0_8_ != local_3d8) {
      operator_delete((void *)local_3e8._0_8_,local_3d8._0_8_ + 1);
    }
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_1d0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_3e8,&local_588,alloc,&local_1d0);
  expected = pbrt::RGBColorSpace::Rec2020;
  actual = pbrt::ImageMetadata::GetColorSpace(&local_2d0);
  testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((internal *)&local_5b8,"*RGBColorSpace::Rec2020","*inMetadata.GetColorSpace()",
             (RGBColorSpace *)expected,actual);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_2d0.renderTimeSeconds.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2d0.renderTimeSeconds.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,
               (AssertionResult *)"(bool)inMetadata.renderTimeSeconds","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b4,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_4_ = 0x4d2;
  if (local_2d0.renderTimeSeconds.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_5b8,"1234","*inMetadata.renderTimeSeconds",(int *)&local_5c8,
             (float *)&local_2d0);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_2d0.cameraFromWorld.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2d0.cameraFromWorld.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,
               (AssertionResult *)"(bool)inMetadata.cameraFromWorld","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b7,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d0.cameraFromWorld.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((internal *)&local_5b8,"*inMetadata.cameraFromWorld","w2c",
             (SquareMatrix<4> *)&local_2d0.cameraFromWorld,&local_70);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_2d0.NDCFromWorld.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2d0.NDCFromWorld.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,(AssertionResult *)"(bool)inMetadata.NDCFromWorld",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1ba,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d0.NDCFromWorld.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((internal *)&local_5b8,"*inMetadata.NDCFromWorld","w2n",
             (SquareMatrix<4> *)&local_2d0.NDCFromWorld,&local_b0);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1bb,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_2d0.pixelBounds.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2d0.pixelBounds.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,(AssertionResult *)"(bool)inMetadata.pixelBounds",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1bd,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d0.pixelBounds.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  testing::internal::CmpHelperEQ<pbrt::Bounds2<int>,pbrt::Bounds2<int>>
            ((internal *)&local_5b8,"*inMetadata.pixelBounds","pb",
             (Bounds2<int> *)&local_2d0.pixelBounds,&local_568);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1be,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_2d0.fullResolution.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2d0.fullResolution.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,
               (AssertionResult *)"(bool)inMetadata.fullResolution","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c0,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d0.fullResolution.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&local_5b8,"*inMetadata.fullResolution","fullRes",
             (Point2<int> *)&local_2d0.fullResolution,(Point2<int> *)&local_590.__align);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5d0.data_._0_4_ = 1;
  local_5c8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_2d0.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_5b8,"1","inMetadata.stringVectors.size()",(int *)&local_5d0,
             (unsigned_long *)&local_5c8);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"yolo","");
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&local_518,&local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = (_Rb_tree_header *)iVar5._M_node != &local_518._M_impl.super__Rb_tree_header;
  local_5c8.ptr_._0_1_ = bVar2;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,(AssertionResult *)"iter != stringVectors.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c5,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5d0.data_ + 8))();
      }
      local_5d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_5b8,"\"foo\"","iter->second[0]",(char (*) [4])"foo",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (iVar5._M_node + 2));
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c6,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_5b8,"\"bar\"","iter->second[1]",(char (*) [4])"bar",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(iVar5._M_node + 2) + 0x20));
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_ = local_5c8.ptr_ & 0xffffffff00000000;
  iVar3 = remove(local_588._M_dataplus._M_p);
  local_5d0.data_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_5b8,"0","remove(filename.c_str())",(int *)&local_5c8,
             (int *)&local_5d0);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c9,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
      local_5c8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_2d0.stringVectors._M_t);
  if (local_2d0.colorSpace.set == true) {
    local_2d0.colorSpace.set = false;
  }
  if (local_2d0.MSE.set == true) {
    local_2d0.MSE.set = false;
  }
  if (local_2d0.samplesPerPixel.set == true) {
    local_2d0.samplesPerPixel.set = false;
  }
  if (local_2d0.fullResolution.set == true) {
    local_2d0.fullResolution.set = false;
  }
  if (local_2d0.pixelBounds.set == true) {
    local_2d0.pixelBounds.set = false;
  }
  if (local_2d0.NDCFromWorld.set == true) {
    local_2d0.NDCFromWorld.set = false;
  }
  if (local_2d0.cameraFromWorld.set == true) {
    local_2d0.cameraFromWorld.set = false;
  }
  if (local_2d0.renderTimeSeconds.set == true) {
    local_2d0.renderTimeSeconds.set = false;
  }
  local_2d8 = 0;
  (*(local_2f0.memoryResource)->_vptr_memory_resource[3])
            (local_2f0.memoryResource,local_2e8,local_2e0 << 2,4);
  local_2f8 = 0;
  (*(local_310.memoryResource)->_vptr_memory_resource[3])
            (local_310.memoryResource,local_308,local_300 * 2,2);
  local_318 = 0;
  (*(local_330.memoryResource)->_vptr_memory_resource[3])
            (local_330.memoryResource,local_328,local_320,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_4e8.stringVectors._M_t);
  if (local_4e8.colorSpace.set == true) {
    local_4e8.colorSpace.set = false;
  }
  if (local_4e8.MSE.set == true) {
    local_4e8.MSE.set = false;
  }
  if (local_4e8.samplesPerPixel.set == true) {
    local_4e8.samplesPerPixel.set = false;
  }
  if (local_4e8.fullResolution.set == true) {
    local_4e8.fullResolution.set = false;
  }
  if (local_4e8.pixelBounds.set == true) {
    local_4e8.pixelBounds.set = false;
  }
  if (local_4e8.NDCFromWorld.set == true) {
    local_4e8.NDCFromWorld.set = false;
  }
  if (local_4e8.cameraFromWorld.set == true) {
    local_4e8.cameraFromWorld.set = false;
  }
  if (local_4e8.renderTimeSeconds.set == true) {
    local_4e8.renderTimeSeconds.set = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_1c8.p32.nStored = 0;
  (*(local_1c8.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1c8.p32.alloc.memoryResource,local_1c8.p32.ptr,local_1c8.p32.nAlloc << 2,4);
  local_1c8.p16.nStored = 0;
  (*(local_1c8.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1c8.p16.alloc.memoryResource,local_1c8.p16.ptr,local_1c8.p16.nAlloc * 2,2);
  local_1c8.p8.nStored = 0;
  (*(local_1c8.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1c8.p8.alloc.memoryResource,local_1c8.p8.ptr,local_1c8.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_1c8.channelNames);
  local_538.nStored = 0;
  (*(local_538.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_538.alloc.memoryResource,local_538.ptr,local_538.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_EQ(0, remove(filename.c_str()));
}